

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_false,_true>::DaTrie
          (DaTrie<false,_false,_true> *this,
          vector<const_char_*,_std::allocator<const_char_*>_> *prefixes)

{
  bool bVar1;
  uint32_t uVar2;
  reference pvVar3;
  reference ppcVar4;
  char *pcVar5;
  undefined8 in_RSI;
  Query *in_RDI;
  Query query;
  char *prefix;
  const_iterator __end2;
  const_iterator __begin2;
  vector<const_char_*,_std::allocator<const_char_*>_> *__range2;
  Query *__lhs;
  Query *query_00;
  DaTrie<false,_false,_true> *this_00;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Query local_58;
  char *local_40;
  char **local_38;
  __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
  local_30;
  undefined8 local_28;
  undefined8 local_10;
  
  query_00 = in_RDI;
  local_10 = in_RSI;
  std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::vector
            ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)0x18149d);
  __lhs = query_00 + 1;
  std::vector<char,_std::allocator<char>_>::vector((vector<char,_std::allocator<char>_> *)0x1814b0);
  this_00 = (DaTrie<false,_false,_true> *)(query_00 + 2);
  std::vector<ddd::Block,_std::allocator<ddd::Block>_>::vector
            ((vector<ddd::Block,_std::allocator<ddd::Block>_> *)0x1814c3);
  std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::vector
            ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)0x1814d6);
  *(undefined4 *)
   &(((_Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> *)&query_00[4].key_)->_M_impl).
    super__Vector_impl_data._M_start = 0xffffffff;
  *(undefined4 *)
   ((long)&(((_Vector_base<ddd::Bc,_std::allocator<ddd::Bc>_> *)&query_00[4].key_)->_M_impl).
           super__Vector_impl_data._M_start + 4) = 0;
  query_00[4].pos_ = 0;
  fix_((DaTrie<false,_false,_true> *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
       (uint32_t)((ulong)this_00 >> 0x20),
       (vector<ddd::Block,_std::allocator<ddd::Block>_> *)query_00);
  pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                     ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,0);
  Bc::set_base(pvVar3,0x7fffffff);
  pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                     ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,0);
  Bc::set_check(pvVar3,0x7fffffff);
  local_28 = local_10;
  local_30._M_current =
       (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::begin
                          ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_RDI);
  local_38 = (char **)std::vector<const_char_*,_std::allocator<const_char_*>_>::end
                                ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_RDI);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                             *)__lhs,(__normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
                                      *)in_RDI), bVar1) {
    ppcVar4 = __gnu_cxx::
              __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
              ::operator*(&local_30);
    local_40 = *ppcVar4;
    Query::Query(&local_58,local_40);
    search_prefix(this_00,query_00);
    pcVar5 = Query::key(&local_58);
    if (*pcVar5 == '\0') {
      in_stack_ffffffffffffffa4 = 3;
    }
    else {
      uVar2 = Query::node_pos(&local_58);
      pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)uVar2);
      uVar2 = Bc::base(pvVar3);
      if (uVar2 != 0x7fffffff) {
        insert_edge_((DaTrie<false,_false,_true> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),(Query *)this_00)
        ;
      }
      while (pcVar5 = Query::key(&local_58), *pcVar5 != '\0') {
        append_edge_((DaTrie<false,_false,_true> *)
                     CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),(Query *)this_00)
        ;
      }
      uVar2 = Query::node_pos(&local_58);
      pvVar3 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[]
                         ((vector<ddd::Bc,_std::allocator<ddd::Bc>_> *)in_RDI,(ulong)uVar2);
      Bc::set_base(pvVar3,0x7fffffff);
      in_stack_ffffffffffffffa4 = 0;
    }
    Query::~Query(&local_58);
    __gnu_cxx::
    __normal_iterator<const_char_*const_*,_std::vector<const_char_*,_std::allocator<const_char_*>_>_>
    ::operator++(&local_30);
  }
  return;
}

Assistant:

DaTrie(const std::vector<const char*>& prefixes) {
    assert(Prefix);

    fix_(ROOT_POS, blocks_);
    bc_[ROOT_POS].set_base(INVALID_VALUE);
    bc_[ROOT_POS].set_check(INVALID_VALUE);

    for (auto prefix : prefixes) {
      Query query(prefix);
      search_prefix(query);
      if (*query.key() == '\0') {
        continue;
      }
      if (bc_[query.node_pos()].base() != INVALID_VALUE) {
        insert_edge_(query);
      }
      while (*query.key() != '\0') {
        append_edge_(query);
      }
      bc_[query.node_pos()].set_base(INVALID_VALUE);
    }
  }